

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# join_iterator.hpp
# Opt level: O1

bool __thiscall
burst::detail::
join_iterator_impl<burst::owning_iterator<std::vector<boost::iterator_range<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<boost::iterator_range<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_boost::iterators::random_access_traversal_tag>
::equal(join_iterator_impl<burst::owning_iterator<std::vector<boost::iterator_range<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<boost::iterator_range<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_boost::iterators::random_access_traversal_tag>
        *this,join_iterator_impl<burst::owning_iterator<std::vector<boost::iterator_range<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<boost::iterator_range<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_boost::iterators::random_access_traversal_tag>
              *that)

{
  if ((this->m_begin).m_container.
      super___shared_ptr<std::vector<boost::iterator_range<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<boost::iterator_range<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr ==
      (that->m_begin).m_container.
      super___shared_ptr<std::vector<boost::iterator_range<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<boost::iterator_range<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr) {
    if ((this->m_begin).m_iterator._M_current != (that->m_begin).m_iterator._M_current) {
      __assert_fail("this->m_begin == that.m_begin",
                    "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/include/burst/iterator/detail/join_iterator.hpp"
                    ,0x188,
                    "bool burst::detail::join_iterator_impl<burst::owning_iterator<std::vector<boost::iterator_range<__gnu_cxx::__normal_iterator<char *, std::basic_string<char>>>>>, boost::iterators::random_access_traversal_tag>::equal(const join_iterator_impl<type-parameter-0-0, random_access_traversal_tag> &) const [InputIterator = burst::owning_iterator<std::vector<boost::iterator_range<__gnu_cxx::__normal_iterator<char *, std::basic_string<char>>>>>, IteratorCategory = boost::iterators::random_access_traversal_tag]"
                   );
    }
    if ((this->m_end).m_container.
        super___shared_ptr<std::vector<boost::iterator_range<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<boost::iterator_range<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr ==
        (that->m_end).m_container.
        super___shared_ptr<std::vector<boost::iterator_range<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<boost::iterator_range<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr) {
      if ((this->m_end).m_iterator._M_current == (that->m_end).m_iterator._M_current) {
        return this->m_items_remaining == that->m_items_remaining;
      }
      __assert_fail("this->m_end == that.m_end",
                    "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/include/burst/iterator/detail/join_iterator.hpp"
                    ,0x189,
                    "bool burst::detail::join_iterator_impl<burst::owning_iterator<std::vector<boost::iterator_range<__gnu_cxx::__normal_iterator<char *, std::basic_string<char>>>>>, boost::iterators::random_access_traversal_tag>::equal(const join_iterator_impl<type-parameter-0-0, random_access_traversal_tag> &) const [InputIterator = burst::owning_iterator<std::vector<boost::iterator_range<__gnu_cxx::__normal_iterator<char *, std::basic_string<char>>>>>, IteratorCategory = boost::iterators::random_access_traversal_tag]"
                   );
    }
  }
  __assert_fail("this->m_container == that.m_container",
                "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/include/burst/iterator/owning_iterator.hpp"
                ,0x55,
                "bool burst::owning_iterator<std::vector<boost::iterator_range<__gnu_cxx::__normal_iterator<char *, std::basic_string<char>>>>>::equal(const owning_iterator<Container> &) const [Container = std::vector<boost::iterator_range<__gnu_cxx::__normal_iterator<char *, std::basic_string<char>>>>]"
               );
}

Assistant:

bool equal (const join_iterator_impl & that) const
            {
                assert(this->m_begin == that.m_begin);
                assert(this->m_end == that.m_end);
                return this->m_items_remaining == that.m_items_remaining;
            }